

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int * Abc_NtkSimulateOneNode(Abc_Ntk_t *pNtk,int *pModel,int input,Vec_Ptr_t **topOrder)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint *__ptr;
  void *pvVar10;
  int *piVar11;
  Abc_Obj_t *pAVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0x32;
  __ptr[1] = 0;
  pvVar10 = malloc(400);
  *(void **)(__ptr + 2) = pvVar10;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar14 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar14) {
      piVar11 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar11;
      if (piVar11 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar14;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar14;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (0x3ffffffe < iVar2) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pAVar12 = Abc_AigConst1(pNtk);
  pAVar12->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  if ((-1 < input) && (input < pNtk->vCis->nSize)) {
    *(int *)((long)pNtk->vCis->pArray[(uint)input] + 0x40) = pModel[(uint)input];
    lVar15 = (long)topOrder[(uint)input]->nSize;
    if (0 < (long)topOrder[(uint)input]->nSize) {
      do {
        if (topOrder[(uint)input]->nSize < lVar15) goto LAB_002983fa;
        plVar4 = (long *)topOrder[(uint)input]->pArray[lVar15 + -1];
        lVar13 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        uVar9 = (*(uint *)((long)plVar4 + 0x14) >> 0xb & 1 ^
                *(uint *)(*(long *)(lVar13 + (long)((int *)plVar4[4])[1] * 8) + 0x40)) &
                (*(uint *)((long)plVar4 + 0x14) >> 10 & 1 ^
                *(uint *)(*(long *)(lVar13 + (long)*(int *)plVar4[4] * 8) + 0x40));
        if (*(uint *)(plVar4 + 8) != uVar9) {
          *(uint *)(plVar4 + 8) = uVar9;
          uVar9 = __ptr[1];
          uVar3 = *__ptr;
          if (uVar9 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar10 = malloc(0x80);
              }
              else {
                pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar16 = 0x10;
            }
            else {
              uVar16 = uVar3 * 2;
              if ((int)uVar16 <= (int)uVar3) goto LAB_002982ef;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar10 = malloc((ulong)uVar3 << 4);
              }
              else {
                pvVar10 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = uVar16;
          }
LAB_002982ef:
          __ptr[1] = uVar9 + 1;
          *(long **)(*(long *)(__ptr + 2) + (long)(int)uVar9 * 8) = plVar4;
        }
        bVar8 = 1 < lVar15;
        lVar15 = lVar15 + -1;
      } while (bVar8);
    }
    pVVar5 = pNtk->vCos;
    lVar15 = (long)pVVar5->nSize;
    piVar11 = (int *)malloc(lVar15 * 4);
    if (0 < lVar15) {
      ppvVar6 = pVVar5->pArray;
      lVar13 = 0;
      do {
        plVar4 = (long *)ppvVar6[lVar13];
        piVar11[lVar13] =
             *(uint *)((long)plVar4 + 0x14) >> 10 & 1 ^
             *(uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                (long)*(int *)plVar4[4] * 8) + 0x40);
        lVar13 = lVar13 + 1;
      } while (lVar15 != lVar13);
    }
    if (input < pNtk->vCis->nSize) {
      pvVar10 = pNtk->vCis->pArray[(uint)input];
      *(ulong *)((long)pvVar10 + 0x40) = (ulong)(*(long *)((long)pvVar10 + 0x40) != 1);
      uVar9 = __ptr[1];
      if (0 < (long)(int)uVar9) {
        lVar15 = *(long *)(__ptr + 2);
        lVar13 = 0;
        do {
          lVar7 = *(long *)(lVar15 + lVar13 * 8);
          *(ulong *)(lVar7 + 0x40) = (ulong)(*(long *)(lVar7 + 0x40) != 1);
          lVar13 = lVar13 + 1;
        } while ((int)uVar9 != lVar13);
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return piVar11;
    }
  }
LAB_002983fa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int * Abc_NtkSimulateOneNode( Abc_Ntk_t * pNtk, int * pModel, int input, Vec_Ptr_t ** topOrder )
{
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int * pValues, Value0, Value1, i;
   
    vNodes = Vec_PtrAlloc( 50 );
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values     
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    pNode = Abc_NtkCi(pNtk, input);
    pNode->iTemp = pModel[input];
    
    // simulate in the topological order    
    for(i = Vec_PtrSize(topOrder[input])-1; i >= 0; i--)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(topOrder[input], i);        
        
        Value0 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ Abc_ObjFaninC1(pNode);
        
        if( pNode->iTemp != (Value0 & Value1))
        {
            pNode->iTemp = (Value0 & Value1);
            Vec_PtrPush(vNodes, pNode);
        }
    
    }    
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
    
    pNode = Abc_NtkCi(pNtk, input);
    if(pNode->pCopy == (Abc_Obj_t *)1)
        pNode->pCopy = (Abc_Obj_t *)0;
    else
        pNode->pCopy = (Abc_Obj_t *)1;

    for(i = 0; i < Vec_PtrSize(vNodes); i++)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i);

        if(pNode->pCopy == (Abc_Obj_t *)1)
            pNode->pCopy = (Abc_Obj_t *)0;
        else
            pNode->pCopy = (Abc_Obj_t *)1;
    }

    Vec_PtrFree( vNodes );

    return pValues;
}